

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O0

void apply_colormap(ColorMap *map)

{
  short sVar1;
  short sVar2;
  int iVar3;
  short local_1c;
  int local_18;
  short fgColor;
  short bgColor;
  int fg;
  int bg;
  ColorMap *map_local;
  
  _fgColor = 0;
  do {
    if (6 < _fgColor) {
      return;
    }
    if (_fgColor == 1) {
      iVar3 = 8;
      if (0xf < _COLORS) {
        iVar3 = 0x10;
      }
      if (_COLOR_PAIRS == iVar3 * 7 ||
          SBORROW4(_COLOR_PAIRS,iVar3 * 7) != _COLOR_PAIRS + iVar3 * -7 < 0) {
        return;
      }
    }
    if (_fgColor == 0) {
      sVar1 = -1;
    }
    else {
      sVar1 = map->bgColors[_fgColor];
    }
    local_18 = 0;
    while( true ) {
      iVar3 = 8;
      if (0xf < _COLORS) {
        iVar3 = 0x10;
      }
      if (iVar3 <= local_18) break;
      local_1c = map->fgColors[local_18];
      if ((local_1c == 0) && (settings.darkgray == '\0')) {
        local_1c = 4;
      }
      if ((local_1c == sVar1) && (local_1c != -1)) {
        local_1c = 0;
      }
      sVar2 = 8;
      if (0xf < _COLORS) {
        sVar2 = 0x10;
      }
      sVar2 = (short)_fgColor * sVar2 + (short)local_18 + 1;
      init_pair((int)sVar2,(int)local_1c,(int)sVar1,sVar2);
      local_18 = local_18 + 1;
    }
    _fgColor = _fgColor + 1;
  } while( true );
}

Assistant:

static void apply_colormap(struct ColorMap *map)
{
    int bg, fg;
    short bgColor, fgColor;

    /* Set up all color pairs.
     * If using bold, then set up color pairs for foreground colors
     *   0-7; if not, then set up color pairs for foreground colors
     *   0-15.
     * If there are sufficient color pairs, then set them up for 6
     * possible non-default background colors (don't use white, there
     * are terminals that hate it).  So there are 112 pairs required
     * for 16 colors, or 56 required for 8 colors. */
    for (bg = 0; bg < BG_COLOR_COUNT; bg++) {
	/* Do not set up background colors if there are not enough
	 * color pairs. */
	if (bg == 1 && !BG_COLOR_SUPPORT)
	    break;

	/* For no background, use the default background color;
	 * otherwise use the color from the color map. */
	bgColor = bg ? map->bgColors[bg] : -1;

	for (fg = 0; fg < FG_COLOR_COUNT; fg++) {
	    fgColor = map->fgColors[fg];

	    /* Replace black with blue if darkgray is not set. */
	    if (fgColor == COLOR_BLACK && !settings.darkgray)
		fgColor = COLOR_BLUE;
	    if (fgColor == bgColor && fgColor != -1)
		fgColor = COLOR_BLACK;

	    init_pair(bg * FG_COLOR_COUNT + fg + 1, fgColor, bgColor);
	}
    }

    return;
}